

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O3

int __thiscall
axl::sl::
ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
::remove(ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
         *this,char *__filename)

{
  size_t *psVar1;
  ListLink *pLVar2;
  HashTableEntry<unsigned_long,_bool> *pHVar3;
  ListLink *pLVar4;
  long *plVar5;
  HashTableEntry<unsigned_long,_bool> *pHVar6;
  
  plVar5 = (long *)(__filename + 0x20);
  if (__filename == (char *)0x0) {
    plVar5 = (long *)0x0;
  }
  pLVar2 = (ListLink *)*plVar5;
  pHVar3 = (HashTableEntry<unsigned_long,_bool> *)plVar5[1];
  if (pHVar3 == (HashTableEntry<unsigned_long,_bool> *)0x0) {
    pHVar6 = (HashTableEntry<unsigned_long,_bool> *)(pLVar2 + -2);
    if (pLVar2 == (ListLink *)0x0) {
      pHVar6 = (HashTableEntry<unsigned_long,_bool> *)0x0;
    }
    (this->super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>).m_head = pHVar6;
  }
  else {
    (pHVar3->super_MapEntry<unsigned_long,_bool>).super_ListLink.m_next = pLVar2;
  }
  pHVar6 = (HashTableEntry<unsigned_long,_bool> *)
           &pHVar3[-1].super_MapEntry<unsigned_long,_bool>.m_value;
  if (pHVar3 == (HashTableEntry<unsigned_long,_bool> *)0x0) {
    pHVar6 = pHVar3;
  }
  pLVar4 = (ListLink *)this;
  if (pLVar2 != (ListLink *)0x0) {
    pHVar6 = pHVar3;
    pLVar4 = pLVar2;
  }
  pLVar4->m_prev = (ListLink *)pHVar6;
  psVar1 = &(this->super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>).m_count;
  *psVar1 = *psVar1 - 1;
  return (int)__filename;
}

Assistant:

T*
	remove(Iterator it) {
		ASSERT(!isEmpty());

		ListLink* link = it.getLink();
		ListLink* next = link->m_next;
		ListLink* prev = link->m_prev;

		if (prev)
			prev->m_next = next;
		else
			this->m_head = Iterator::getEntryFromLink(next);

		if (next)
			next->m_prev = prev;
		else
			this->m_tail = Iterator::getEntryFromLink(prev);

		this->m_count--;
		return it.getEntry();
	}